

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j,short *data,stbi__huffman *hac,stbi__int16 *fac)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ushort *puVar7;
  byte bVar8;
  short *p_1;
  ushort local_60;
  int rs_1;
  int s_1;
  int r_1;
  short *p;
  short bit;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int shift;
  int k;
  stbi__int16 *fac_local;
  stbi__huffman *hac_local;
  short *data_local;
  stbi__jpeg *j_local;
  
  if (j->spec_start == 0) {
    j_local._4_4_ = stbi__err("can\'t merge dc and ac");
  }
  else {
    if (j->succ_high == 0) {
      iVar6 = j->succ_low;
      if (j->eob_run != 0) {
        j->eob_run = j->eob_run + -1;
        return 1;
      }
      zig = j->spec_start;
      do {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        sVar2 = fac[(int)(j->code_buffer >> 0x17)];
        uVar4 = (uint)sVar2;
        bVar8 = (byte)iVar6;
        if (uVar4 == 0) {
          uVar4 = stbi__jpeg_huff_decode(j,hac);
          if ((int)uVar4 < 0) {
            iVar6 = stbi__err("bad huffman code");
            return iVar6;
          }
          iVar5 = (int)uVar4 >> 4;
          if ((uVar4 & 0xf) == 0) {
            if (iVar5 < 0xf) {
              j->eob_run = 1 << ((byte)iVar5 & 0x1f);
              if (iVar5 != 0) {
                iVar6 = stbi__jpeg_get_bits(j,iVar5);
                j->eob_run = iVar6 + j->eob_run;
              }
              j->eob_run = j->eob_run + -1;
              break;
            }
            zig = zig + 0x10;
          }
          else {
            iVar5 = iVar5 + zig;
            zig = iVar5 + 1;
            bVar1 = ""[iVar5];
            iVar5 = stbi__extend_receive(j,uVar4 & 0xf);
            data[bVar1] = (short)iVar5 * (short)(1 << (bVar8 & 0x1f));
          }
        }
        else {
          iVar5 = ((int)uVar4 >> 4 & 0xfU) + zig;
          uVar4 = uVar4 & 0xf;
          if (j->code_bits < (int)uVar4) {
            iVar6 = stbi__err("bad huffman code");
            return iVar6;
          }
          j->code_buffer = j->code_buffer << (sbyte)uVar4;
          j->code_bits = j->code_bits - uVar4;
          zig = iVar5 + 1;
          data[""[iVar5]] = (short)(char)((ushort)sVar2 >> 8) * (short)(1 << (bVar8 & 0x1f));
        }
      } while ((int)zig <= j->spec_end);
    }
    else {
      uVar3 = (ushort)(1 << ((byte)j->succ_low & 0x1f));
      if (j->eob_run == 0) {
        zig = j->spec_start;
        do {
          uVar4 = stbi__jpeg_huff_decode(j,hac);
          if ((int)uVar4 < 0) {
            iVar6 = stbi__err("bad huffman code");
            return iVar6;
          }
          rs_1 = (int)uVar4 >> 4;
          if ((uVar4 & 0xf) == 0) {
            if (rs_1 < 0xf) {
              j->eob_run = (1 << ((byte)rs_1 & 0x1f)) + -1;
              if (rs_1 != 0) {
                iVar6 = stbi__jpeg_get_bits(j,rs_1);
                j->eob_run = iVar6 + j->eob_run;
              }
              rs_1 = 0x40;
            }
            local_60 = 0;
          }
          else {
            if ((uVar4 & 0xf) != 1) {
              iVar6 = stbi__err("bad huffman code");
              return iVar6;
            }
            iVar6 = stbi__jpeg_get_bit(j);
            local_60 = uVar3;
            if (iVar6 == 0) {
              local_60 = -uVar3;
            }
          }
          while ((int)zig <= j->spec_end) {
            uVar4 = zig + 1;
            puVar7 = (ushort *)(data + ""[(int)zig]);
            zig = uVar4;
            if (*puVar7 == 0) {
              if (rs_1 == 0) {
                *puVar7 = local_60;
                break;
              }
              rs_1 = rs_1 + -1;
            }
            else {
              iVar6 = stbi__jpeg_get_bit(j);
              if ((iVar6 != 0) && ((*puVar7 & uVar3) == 0)) {
                if ((short)*puVar7 < 1) {
                  *puVar7 = *puVar7 - uVar3;
                }
                else {
                  *puVar7 = *puVar7 + uVar3;
                }
              }
            }
          }
        } while ((int)zig <= j->spec_end);
      }
      else {
        j->eob_run = j->eob_run + -1;
        for (zig = j->spec_start; (int)zig <= j->spec_end; zig = zig + 1) {
          puVar7 = (ushort *)(data + ""[(int)zig]);
          if (((*puVar7 != 0) && (iVar6 = stbi__jpeg_get_bit(j), iVar6 != 0)) &&
             ((*puVar7 & uVar3) == 0)) {
            if ((short)*puVar7 < 1) {
              *puVar7 = *puVar7 - uVar3;
            }
            else {
              *puVar7 = *puVar7 + uVar3;
            }
          }
        }
      }
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j, short data[64], stbi__huffman *hac, stbi__int16 *fac)
{
   int k;
   if (j->spec_start == 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->succ_high == 0) {
      int shift = j->succ_low;

      if (j->eob_run) {
         --j->eob_run;
         return 1;
      }

      k = j->spec_start;
      do {
         unsigned int zig;
         int c,r,s;
         if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
         c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
         r = fac[c];
         if (r) { // fast-AC path
            k += (r >> 4) & 15; // run
            s = r & 15; // combined length
            if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
            j->code_buffer <<= s;
            j->code_bits -= s;
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) ((r >> 8) * (1 << shift));
         } else {
            int rs = stbi__jpeg_huff_decode(j, hac);
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r);
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  --j->eob_run;
                  break;
               }
               k += 16;
            } else {
               k += r;
               zig = stbi__jpeg_dezigzag[k++];
               data[zig] = (short) (stbi__extend_receive(j,s) * (1 << shift));
            }
         }
      } while (k <= j->spec_end);
   } else {
      // refinement scan for these AC coefficients

      short bit = (short) (1 << j->succ_low);

      if (j->eob_run) {
         --j->eob_run;
         for (k = j->spec_start; k <= j->spec_end; ++k) {
            short *p = &data[stbi__jpeg_dezigzag[k]];
            if (*p != 0)
               if (stbi__jpeg_get_bit(j))
                  if ((*p & bit)==0) {
                     if (*p > 0)
                        *p += bit;
                     else
                        *p -= bit;
                  }
         }
      } else {
         k = j->spec_start;
         do {
            int r,s;
            int rs = stbi__jpeg_huff_decode(j, hac); // @OPTIMIZE see if we can use the fast path here, advance-by-r is so slow, eh
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r) - 1;
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  r = 64; // force end of block
               } else {
                  // r=15 s=0 should write 16 0s, so we just do
                  // a run of 15 0s and then write s (which is 0),
                  // so we don't have to do anything special here
               }
            } else {
               if (s != 1) return stbi__err("bad huffman code", "Corrupt JPEG");
               // sign bit
               if (stbi__jpeg_get_bit(j))
                  s = bit;
               else
                  s = -bit;
            }

            // advance by r
            while (k <= j->spec_end) {
               short *p = &data[stbi__jpeg_dezigzag[k++]];
               if (*p != 0) {
                  if (stbi__jpeg_get_bit(j))
                     if ((*p & bit)==0) {
                        if (*p > 0)
                           *p += bit;
                        else
                           *p -= bit;
                     }
               } else {
                  if (r == 0) {
                     *p = (short) s;
                     break;
                  }
                  --r;
               }
            }
         } while (k <= j->spec_end);
      }
   }
   return 1;
}